

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.c
# Opt level: O3

int bmp_create_bw(char *filename,uint32_t w,uint32_t h,uint8_t *data)

{
  bool bVar1;
  void *__ptr;
  FILE *__s;
  int iVar2;
  uint8_t *data_00;
  int iVar3;
  ulong __size;
  char *pcVar4;
  char cVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  
  __size = (ulong)(w * h * 3 + 0x36);
  data_00 = data;
  __ptr = malloc(__size);
  create_header((char *)(ulong)w,h,(uint32_t)__ptr,data_00);
  if (-1 < (int)(h - 1)) {
    iVar2 = 4 - (w & 3);
    if ((w & 3) == 0) {
      iVar2 = 0;
    }
    iVar3 = 0x36;
    iVar8 = h - 1;
    do {
      if (w != 0) {
        pcVar4 = (char *)((long)__ptr + (long)iVar3 + 2);
        iVar3 = iVar3 + w * 3;
        uVar7 = 0;
        do {
          cVar5 = ((data[(int)(uVar7 >> 3) + iVar8 * (w >> 3)] >> ((uint)uVar7 & 7) & 1) != 0) + -1;
          pcVar4[-2] = cVar5;
          pcVar4[-1] = cVar5;
          *pcVar4 = cVar5;
          uVar6 = (uint)uVar7 + 1;
          uVar7 = (ulong)uVar6;
          pcVar4 = pcVar4 + 3;
        } while (w != uVar6);
      }
      iVar3 = iVar3 + iVar2;
      bVar1 = 0 < iVar8;
      iVar8 = iVar8 + -1;
    } while (bVar1);
  }
  __s = fopen(filename,"w");
  fwrite(__ptr,1,__size,__s);
  fclose(__s);
  free(__ptr);
  return 0;
}

Assistant:

int bmp_create_bw(char* filename, uint32_t w, uint32_t h, uint8_t* data) {

	FILE *f;
	int index = 0;

	uint32_t filesize = BMP_FILE_HEADER_SIZE + BMP_INFO_HEADER_SIZE + w * h * 3;
	uint8_t* filedata = (uint8_t*)malloc(filesize);

	//Create header
	index += create_header(filename, w, h, filedata);

	//Write data
	for (int i = h - 1; i >= 0; i--) {
		for (int j = 0; j < w; j++) {

			uint8_t byte = data[i * (w / 8) + (j / 8)];
			uint8_t mask = 1 << (j % 8);

			if ((byte & mask) != 0) {
				filedata[index + 0] = 0x00;
				filedata[index + 1] = 0x00;
				filedata[index + 2] = 0x00;
			} else {
				filedata[index + 0] = 0xFF;
				filedata[index + 1] = 0xFF;
				filedata[index + 2] = 0xFF;
			}
			index += 3;
		}

		//Padding should ensure each section is word aligned
		//TODO: this is broken
		index += (w % 4 != 0) ? 4 - (w % 4) : 0;
	}

	//Write file
	f = fopen(filename, "w");
	fwrite(filedata, 1, filesize, f);
	fclose(f);

	free(filedata);

	return 0;
}